

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-open.c
# Opt level: O0

void close_socket(uv_os_sock_t sock)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  uv_os_sock_t sock_local;
  
  iVar1 = close(sock);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-open.c"
            ,0x4f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void close_socket(uv_os_sock_t sock) {
  int r;
#ifdef _WIN32
  r = closesocket(sock);
#else
  r = close(sock);
#endif
  ASSERT_OK(r);
}